

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_ltrim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  int local_74;
  int i;
  char *zPtr;
  char *zCur;
  char *zEnd;
  char *pcStack_50;
  int nListlen;
  char *zList;
  SyString sStr;
  int nLen;
  char *zString;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    zPtr = jx9_value_to_string(*apArg,(int *)&sStr.field_0xc);
    if ((int)sStr._12_4_ < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else if (nArg < 2) {
      sStr.zString._0_4_ = sStr._12_4_;
      zList = zPtr;
      while( true ) {
        bVar4 = false;
        if ((((int)sStr.zString != 0) && (bVar4 = false, (byte)*zList < 0xc0)) &&
           (bVar4 = true, *zList != '\0')) {
          ppuVar2 = __ctype_b_loc();
          bVar4 = ((*ppuVar2)[(int)*zList] & 0x2000) != 0;
        }
        if (!bVar4) break;
        sStr.zString._0_4_ = (int)sStr.zString + -1;
        zList = zList + 1;
      }
      jx9_result_string(pCtx,zList,(int)sStr.zString);
    }
    else {
      pcStack_50 = jx9_value_to_string(apArg[1],(int *)((long)&zEnd + 4));
      if (zEnd._4_4_ < 1) {
        jx9_result_string(pCtx,zPtr,sStr._12_4_);
      }
      else {
        pcVar3 = zPtr + (int)sStr._12_4_;
        do {
          pcVar1 = zPtr;
          if (pcVar3 <= zPtr) break;
          for (local_74 = 0; local_74 < zEnd._4_4_; local_74 = local_74 + 1) {
            if ((zPtr < pcVar3) && (*zPtr == pcStack_50[local_74])) {
              zPtr = zPtr + 1;
            }
          }
        } while (zPtr != pcVar1);
        if (zPtr < pcVar3) {
          jx9_result_string(pCtx,zPtr,(int)pcVar3 - (int)zPtr);
        }
        else {
          jx9_result_string(pCtx,"",0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_ltrim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL byte */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringLeftTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}